

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O3

void __thiscall
mocker::SemanticChecker::collectSymbols::Collect::operator()(Collect *this,ClassDecl *decl)

{
  element_type *peVar1;
  bool bVar2;
  DuplicatedSymbols *this_00;
  mapped_type *beg;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  SymTbl *this_01;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  ScopeID local_50;
  shared_ptr<mocker::ast::Declaration> local_38;
  
  this_01 = &this->ctx->syms;
  SymTbl::global(this_01);
  peVar1 = (decl->identifier).
           super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mocker::ast::ASTNode,void>
            ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             (__weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2> *)
             &(decl->super_Declaration).super_ASTNode.
              super_enable_shared_from_this<mocker::ast::ASTNode>);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  local_38.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_60;
  local_38.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_58;
  bVar2 = SymTbl::addSymbol(this_01,&local_50,&peVar1->val,&local_38);
  if (local_38.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_50.ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.ids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.ids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (bVar2) {
    return;
  }
  this_00 = (DuplicatedSymbols *)__cxa_allocate_exception(0x68);
  local_50.ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)decl;
  beg = std::
        unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
        ::at(this->pos,(key_type *)&local_50);
  DuplicatedSymbols::DuplicatedSymbols
            (this_00,&beg->first,&beg->second,
             &((decl->identifier).
               super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->val)
  ;
  __cxa_throw(this_00,&DuplicatedSymbols::typeinfo,DuplicatedSymbols::~DuplicatedSymbols);
}

Assistant:

void operator()(ast::ClassDecl &decl) const override {
      auto res = ctx.syms.addSymbol(
          ctx.syms.global(), decl.identifier->val,
          std::static_pointer_cast<ast::ClassDecl>(decl.shared_from_this()));
      if (!res)
        throw DuplicatedSymbols(pos.at(decl.getID()), decl.identifier->val);
    }